

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeEmpty(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *lp)

{
  uint *puVar1;
  undefined8 *puVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  int *piVar5;
  SPxOut *pSVar6;
  char cVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  double *pdVar11;
  pointer pnVar12;
  EmptyConstraintPS *pEVar13;
  FixVariablePS *this_00;
  Result RVar14;
  long lVar15;
  uint j;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  cpp_dec_float<50U,_int,_void> *this_01;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr2;
  undefined1 local_488 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_480;
  uint local_478 [3];
  undefined3 uStack_46b;
  uint local_468;
  undefined3 uStack_463;
  int local_460;
  bool local_45c;
  undefined8 local_458;
  ulong local_448;
  ulong local_440;
  long local_438;
  long local_430;
  uint local_428 [6];
  undefined5 uStack_410;
  undefined3 uStack_40b;
  undefined5 local_408;
  undefined3 uStack_403;
  int local_400;
  undefined1 local_3fc;
  undefined8 local_3f8;
  int local_3ec;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_3e8;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_3e0;
  double local_3d8;
  undefined8 uStack_3d0;
  undefined4 local_3c8;
  uint uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  shared_ptr<soplex::Tolerances> local_3b0;
  value_type local_3a0;
  shared_ptr<soplex::Tolerances> local_390;
  shared_ptr<soplex::Tolerances> local_380;
  long local_370;
  element_type *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_360;
  uint local_358 [2];
  undefined8 uStack_350;
  undefined8 local_348;
  EmptyConstraintPS *local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_330;
  uint local_328 [2];
  undefined8 uStack_320;
  undefined8 local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined5 uStack_1b0;
  undefined3 uStack_1ab;
  undefined5 uStack_1a8;
  undefined8 uStack_1a3;
  undefined8 local_198;
  cpp_dec_float<50U,_int,_void> local_188;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined5 uStack_130;
  undefined3 uStack_12b;
  undefined5 uStack_128;
  undefined8 uStack_123;
  undefined8 local_118;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar10 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  lVar17 = (long)iVar10;
  local_3e0 = &this->m_hist;
  local_448 = (ulong)(iVar10 - 1);
  uVar18 = lVar17 * 8 - 4;
  lVar16 = lVar17 * 0x1c + -4;
  local_370 = lVar17 * 4 + -4;
  lVar15 = 0;
  local_3ec = 0;
  local_440 = uVar18;
  local_438 = lVar17;
  local_3e8 = this;
  do {
    lVar19 = lVar17 + lVar15;
    if (lVar19 < 1) break;
    bVar9 = true;
    if ((lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.theitem
        [*(int *)((long)&(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thekey[lVar15].info + uVar18)].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused == 0) {
      pnVar12 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_248.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -0x10);
      puVar1 = (uint *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -0x30);
      local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_248.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -0x20);
      local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_248.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_248.m_backend.exp = *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -8)
      ;
      local_248.m_backend.neg =
           *(bool *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -4);
      local_248.m_backend._48_8_ =
           *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2);
      local_118 = 0xa00000000;
      local_148 = 0;
      uStack_140 = 0;
      local_138 = 0;
      uStack_130 = 0;
      uStack_12b = 0;
      uStack_128 = 0;
      uStack_123 = 0;
      local_430 = lVar19;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_148,0.0);
      feastol(&local_68,this);
      bVar9 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_248,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_148,&local_68);
      if (bVar9) {
        bVar9 = false;
        lVar17 = local_438;
        uVar18 = local_440;
        lVar19 = local_430;
      }
      else {
        pnVar12 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_318 = *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -0x10);
        puVar2 = (undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -0x30);
        local_338 = (EmptyConstraintPS *)*puVar2;
        p_Stack_330 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
        puVar1 = (uint *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -0x20);
        local_328 = *(uint (*) [2])puVar1;
        uStack_320 = *(undefined8 *)(puVar1 + 2);
        iVar10 = *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -8);
        local_3c8 = CONCAT31(local_3c8._1_3_,
                             *(undefined1 *)
                              ((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2 + -4));
        local_3d8 = *(double *)((long)(pnVar12->m_backend).data._M_elems + lVar16 * 2);
        local_188.fpclass = cpp_dec_float_finite;
        local_188.prec_elem = 10;
        local_188.data._M_elems[0] = 0;
        local_188.data._M_elems[1] = 0;
        local_188.data._M_elems[2] = 0;
        local_188.data._M_elems[3] = 0;
        local_188.data._M_elems[4] = 0;
        local_188.data._M_elems[5] = 0;
        local_188.data._M_elems._24_5_ = 0;
        local_188.data._M_elems[7]._1_3_ = 0;
        local_188.data._M_elems._32_5_ = 0;
        local_188._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_188,0.0);
        feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_d8,this);
        _local_468 = (undefined5)local_318;
        uStack_463 = (undefined3)((ulong)local_318 >> 0x28);
        local_478[0] = local_328[0];
        local_478[1] = local_328[1];
        stack0xfffffffffffffb90 = (undefined5)uStack_320;
        uStack_46b = (undefined3)((ulong)uStack_320 >> 0x28);
        local_488 = (undefined1  [8])local_338;
        _Stack_480._M_pi = p_Stack_330;
        local_45c = (bool)(undefined1)local_3c8;
        local_458 = local_3d8;
        local_460 = iVar10;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_488,&local_188);
        if ((((fpclass_type)local_458 == cpp_dec_float_NaN) ||
            (local_d8.fpclass == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_488,&local_d8), iVar10 < 1))
        {
          lVar19 = local_430;
          pEVar13 = (EmptyConstraintPS *)operator_new(0x68);
          this = local_3e8;
          local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (local_3e8->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (local_3e8->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          EmptyConstraintPS::EmptyConstraintPS(pEVar13,lp,(int)local_448 + (int)lVar15,&local_380);
          local_488 = (undefined1  [8])pEVar13;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::EmptyConstraintPS*>
                    (&_Stack_480,pEVar13);
          if (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&local_3e0->data,(value_type *)local_488);
          piVar5 = (this->m_rIdx).data;
          *(int *)((long)piVar5 + lVar15 * 4 + local_370) =
               piVar5[(long)(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum + -1];
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0xf])(lp,(ulong)(uint)((int)local_448 + (int)lVar15));
          piVar5 = (this->m_stat).data;
          *piVar5 = *piVar5 + 1;
          if (_Stack_480._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_480._M_pi);
          }
          local_3ec = local_3ec + 1;
          bVar9 = true;
          lVar17 = local_438;
          uVar18 = local_440;
        }
        else {
          bVar9 = false;
          lVar17 = local_438;
          uVar18 = local_440;
          lVar19 = local_430;
          this = local_3e8;
        }
      }
    }
    lVar15 = lVar15 + -1;
    lVar16 = lVar16 + -0x1c;
  } while (bVar9);
  RVar14 = INFEASIBLE;
  if (lVar19 < 1) {
    j = (lp->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum;
    lVar17 = (long)(int)j;
    pdVar11 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_3d8 = *pdVar11;
    local_3c8 = SUB84(local_3d8,0);
    uStack_3d0 = 0;
    uStack_3c4 = (uint)((ulong)local_3d8 >> 0x20) ^ 0x80000000;
    uStack_3c0 = 0;
    uStack_3bc = 0x80000000;
    lVar15 = lVar17 * 0x38;
    local_448._0_4_ = INFEASIBLE;
    local_440 = local_440 & 0xffffffff00000000;
    do {
      j = j - 1;
      lVar16 = lVar17;
      if (lVar17 < 1) break;
      bVar9 = true;
      if ((lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.theitem
          [(lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[lVar17 + -1].idx].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 0) {
        local_438 = CONCAT44(local_438._4_4_,j);
        pnVar12 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_3f8._0_4_ = cpp_dec_float_finite;
        local_3f8._4_4_ = 10;
        local_428[0] = 0;
        local_428[1] = 0;
        local_428[2] = 0;
        local_428[3] = 0;
        local_428[4] = 0;
        local_428[5] = 0;
        uStack_410 = 0;
        uStack_40b = 0;
        local_408 = 0;
        uStack_403 = 0;
        local_400 = 0;
        local_3fc = 0;
        puVar1 = (uint *)((long)pnVar12[-1].m_backend.data._M_elems + lVar15);
        local_368 = *(element_type **)puVar1;
        p_Stack_360 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar1 + 2);
        puVar1 = (uint *)((long)(&(pnVar12->m_backend).data + -1) + lVar15);
        local_358 = *(uint (*) [2])puVar1;
        uStack_350 = *(undefined8 *)(puVar1 + 2);
        local_348 = *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0x18);
        iVar10 = *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0x10);
        uVar3 = *(undefined1 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0xc);
        uVar4 = *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -8);
        local_208.fpclass = cpp_dec_float_finite;
        local_208.prec_elem = 10;
        local_208.data._M_elems[0] = 0;
        local_208.data._M_elems[1] = 0;
        local_208.data._M_elems[2] = 0;
        local_208.data._M_elems[3] = 0;
        local_208.data._M_elems[4] = 0;
        local_208.data._M_elems[5] = 0;
        local_208.data._M_elems._24_5_ = 0;
        local_208.data._M_elems[7]._1_3_ = 0;
        local_208.data._M_elems._32_5_ = 0;
        local_208._37_8_ = 0;
        local_430 = lVar17;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_208,0.0);
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_110,this);
        _local_468 = (undefined5)local_348;
        uStack_463 = (undefined3)((ulong)local_348 >> 0x28);
        local_478[0] = local_358[0];
        local_478[1] = local_358[1];
        stack0xfffffffffffffb90 = (undefined5)uStack_350;
        uStack_46b = (undefined3)((ulong)uStack_350 >> 0x28);
        local_488 = (undefined1  [8])local_368;
        _Stack_480._M_pi = p_Stack_360;
        local_460 = iVar10;
        local_45c = (bool)uVar3;
        local_458 = uVar4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_488,&local_208);
        if ((((fpclass_type)local_458 == cpp_dec_float_NaN) ||
            (local_110.fpclass == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_488,&local_110),
           this = local_3e8, iVar10 < 1)) {
          pnVar12 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).object.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_288.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0x18);
          puVar1 = (uint *)((long)pnVar12[-1].m_backend.data._M_elems + lVar15);
          local_288.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_288.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(&(pnVar12->m_backend).data + -1) + lVar15);
          local_288.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_288.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_288.m_backend.exp =
               *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0x10);
          local_288.m_backend.neg =
               *(bool *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0xc);
          local_288.m_backend._48_8_ =
               *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -8);
          local_198 = 0xa00000000;
          local_1c8 = 0;
          uStack_1c0 = 0;
          local_1b8 = 0;
          uStack_1b0 = 0;
          uStack_1ab = 0;
          uStack_1a8 = 0;
          uStack_1a3 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1c8,0.0);
          this = local_3e8;
          epsZero(&local_a0,local_3e8);
          bVar9 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_288,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1c8,&local_a0);
          pnVar12 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          this_01 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)pnVar12[-1].m_backend.data._M_elems + lVar15);
          j = (uint)local_438;
          if (bVar9) {
            ::soplex::infinity::__tls_init();
            local_458._0_4_ = cpp_dec_float_finite;
            local_458._4_4_ = 10;
            local_488 = (undefined1  [8])0x0;
            _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_478[0] = 0;
            local_478[1] = 0;
            stack0xfffffffffffffb90 = 0;
            uStack_46b = 0;
            _local_468 = 0;
            uStack_463 = 0;
            local_460 = 0;
            local_45c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_488,
                       (double)CONCAT44(uStack_3c4,local_3c8));
            if (((*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -8) != 2) &&
                ((fpclass_type)local_458 != cpp_dec_float_NaN)) &&
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (this_01,(cpp_dec_float<50U,_int,_void> *)local_488), iVar10 < 1)
               ) {
              bVar9 = false;
              local_448._0_4_ = UNBOUNDED;
              lVar16 = local_430;
              goto LAB_00331656;
            }
LAB_00331312:
            pnVar12 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_003313a8;
          }
          ::soplex::infinity::__tls_init();
          local_458._0_4_ = cpp_dec_float_finite;
          local_458._4_4_ = 10;
          local_488 = (undefined1  [8])0x0;
          _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_478[0] = 0;
          local_478[1] = 0;
          stack0xfffffffffffffb90 = 0;
          uStack_46b = 0;
          _local_468 = 0;
          uStack_463 = 0;
          local_460 = 0;
          local_45c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_488,(double)CONCAT44(uStack_3c4,local_3c8)
                    );
          if (((*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -8) != 2) &&
              ((fpclass_type)local_458 != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (this_01,(cpp_dec_float<50U,_int,_void> *)local_488), 0 < iVar10))
          goto LAB_00331312;
          pnVar12 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_458._0_4_ = cpp_dec_float_finite;
          local_458._4_4_ = 10;
          local_488 = (undefined1  [8])0x0;
          _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_478[0] = 0;
          local_478[1] = 0;
          stack0xfffffffffffffb90 = 0;
          uStack_46b = 0;
          _local_468 = 0;
          uStack_463 = 0;
          local_460 = 0;
          local_45c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_488,local_3d8);
          if (((*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -8) != 2) &&
              ((fpclass_type)local_458 != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar12[-1].m_backend.data._M_elems + lVar15),
                                  (cpp_dec_float<50U,_int,_void> *)local_488), iVar10 < 0))
          goto LAB_003313a1;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_428,0.0);
        }
        else {
          pnVar12 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          j = (uint)local_438;
          ::soplex::infinity::__tls_init();
          local_458._0_4_ = cpp_dec_float_finite;
          local_458._4_4_ = 10;
          local_488 = (undefined1  [8])0x0;
          _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_478[0] = 0;
          local_478[1] = 0;
          stack0xfffffffffffffb90 = 0;
          uStack_46b = 0;
          _local_468 = 0;
          uStack_463 = 0;
          local_460 = 0;
          local_45c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_488,local_3d8);
          if (((*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -8) != 2) &&
              ((fpclass_type)local_458 != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar12[-1].m_backend.data._M_elems + lVar15),
                                  (cpp_dec_float<50U,_int,_void> *)local_488), -1 < iVar10)) {
            bVar9 = false;
            local_448._0_4_ = UNBOUNDED;
            lVar16 = local_430;
            goto LAB_00331656;
          }
LAB_003313a1:
          pnVar12 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_003313a8:
          uVar4 = *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0x18);
          local_408 = (undefined5)uVar4;
          uStack_403 = (undefined3)((ulong)uVar4 >> 0x28);
          puVar1 = (uint *)((long)pnVar12[-1].m_backend.data._M_elems + lVar15);
          local_428._0_8_ = *(undefined8 *)puVar1;
          local_428._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(&(pnVar12->m_backend).data + -1) + lVar15);
          local_428._16_8_ = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 2);
          uStack_410 = (undefined5)uVar4;
          uStack_40b = (undefined3)((ulong)uVar4 >> 0x28);
          local_400 = *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0x10);
          local_3fc = *(undefined1 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -0xc);
          local_3f8 = *(undefined8 *)((long)(pnVar12->m_backend).data._M_elems + lVar15 + -8);
        }
        pEVar13 = (EmptyConstraintPS *)operator_new(0x30);
        local_2c8.m_backend.data._M_elems[9]._1_3_ = uStack_403;
        local_2c8.m_backend.data._M_elems._32_5_ = local_408;
        local_2c8.m_backend.data._M_elems[7]._1_3_ = uStack_40b;
        local_2c8.m_backend.data._M_elems._24_5_ = uStack_410;
        local_2c8.m_backend.data._M_elems[4] = local_428[4];
        local_2c8.m_backend.data._M_elems[5] = local_428[5];
        local_2c8.m_backend.data._M_elems[0] = local_428[0];
        local_2c8.m_backend.data._M_elems[1] = local_428[1];
        local_2c8.m_backend.data._M_elems[2] = local_428[2];
        local_2c8.m_backend.data._M_elems[3] = local_428[3];
        local_2c8.m_backend.exp = local_400;
        local_2c8.m_backend.neg = (bool)local_3fc;
        local_2c8.m_backend.fpclass = (fpclass_type)local_3f8;
        local_2c8.m_backend.prec_elem = local_3f8._4_4_;
        local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        FixBoundsPS::FixBoundsPS((FixBoundsPS *)pEVar13,lp,j,&local_2c8,&local_390);
        local_488 = (undefined1  [8])pEVar13;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                  (&_Stack_480,(FixBoundsPS *)pEVar13);
        if (local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_390.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_00 = (FixVariablePS *)operator_new(0x138);
        local_308.m_backend.data._M_elems[9]._1_3_ = uStack_403;
        local_308.m_backend.data._M_elems._32_5_ = local_408;
        local_308.m_backend.data._M_elems[7]._1_3_ = uStack_40b;
        local_308.m_backend.data._M_elems._24_5_ = uStack_410;
        local_308.m_backend.data._M_elems[4] = local_428[4];
        local_308.m_backend.data._M_elems[5] = local_428[5];
        local_308.m_backend.data._M_elems[0] = local_428[0];
        local_308.m_backend.data._M_elems[1] = local_428[1];
        local_308.m_backend.data._M_elems[2] = local_428[2];
        local_308.m_backend.data._M_elems[3] = local_428[3];
        local_308.m_backend.exp = local_400;
        local_308.m_backend.neg = (bool)local_3fc;
        local_308.m_backend.fpclass = (fpclass_type)local_3f8;
        local_308.m_backend.prec_elem = local_3f8._4_4_;
        local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        FixVariablePS::FixVariablePS(this_00,lp,this,j,&local_308,&local_3b0,true);
        local_3a0.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS*>
                  (&local_3a0.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,this_00);
        if (local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3b0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&local_3e0->data,(value_type *)local_488);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&local_3e0->data,&local_3a0);
        piVar5 = (this->m_cIdx).data;
        piVar5[local_430 + -1] =
             piVar5[(long)(lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum + -1];
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x15])(lp,(ulong)j);
        piVar5 = (this->m_stat).data + 4;
        *piVar5 = *piVar5 + 1;
        if (local_3a0.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3a0.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (_Stack_480._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_480._M_pi);
        }
        local_440 = CONCAT44(local_440._4_4_,(int)local_440 + 1);
        bVar9 = true;
        lVar16 = local_430;
      }
LAB_00331656:
      lVar15 = lVar15 + -0x38;
      lVar17 = lVar16 + -1;
    } while (bVar9);
    iVar10 = local_3ec;
    RVar14 = (Result)local_448;
    if (lVar16 < 1) {
      RVar14 = OKAY;
      iVar8 = (int)local_440;
      if ((int)local_440 + local_3ec != 0 &&
          SCARRY4((int)local_440,local_3ec) == (int)local_440 + local_3ec < 0) {
        piVar5 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remRows;
        *piVar5 = *piVar5 + local_3ec;
        piVar5 = &(this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remCols;
        *piVar5 = *piVar5 + (int)local_440;
        pSVar6 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
          local_488._0_4_ = pSVar6->m_verbosity;
          local_428[0] = 4;
          (*pSVar6->_vptr_SPxOut[2])();
          pSVar6 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar6->m_streams[pSVar6->m_verbosity],
                     "Simplifier (empty rows/colums) removed ",0x27);
          std::ostream::operator<<((ostream *)pSVar6->m_streams[pSVar6->m_verbosity],iVar10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar6->m_streams[pSVar6->m_verbosity]," rows, ",7);
          std::ostream::operator<<((ostream *)pSVar6->m_streams[pSVar6->m_verbosity],iVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar6->m_streams[pSVar6->m_verbosity]," cols",5);
          cVar7 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          pSVar6 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          RVar14 = OKAY;
          (*pSVar6->_vptr_SPxOut[2])(pSVar6,local_488);
        }
      }
    }
  }
  return RVar14;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}